

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_ClearFreeMemory(ImDrawList *this)

{
  ImDrawList *this_local;
  
  ImVector<ImDrawCmd>::clear(&this->CmdBuffer);
  ImVector<unsigned_short>::clear(&this->IdxBuffer);
  ImVector<ImDrawVert>::clear(&this->VtxBuffer);
  this->Flags = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ImVector<ImVec4>::clear(&this->_ClipRectStack);
  ImVector<void_*>::clear(&this->_TextureIdStack);
  ImVector<ImVec2>::clear(&this->_Path);
  ImDrawListSplitter::ClearFreeMemory(&this->_Splitter);
  return;
}

Assistant:

void ImDrawList::_ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    Flags = ImDrawListFlags_None;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _Splitter.ClearFreeMemory();
}